

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rmro(ASMState *as,x86Op xo,Reg rr,Reg rb,int32_t ofs)

{
  int32_t *piVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int32_t *piStack_58;
  x86Mode mode;
  MCode *p;
  int32_t ofs_local;
  Reg rb_local;
  Reg rr_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_10;
  
  piVar1 = (int32_t *)as->mcp;
  if ((rb & 0x80) == 0) {
    if (rb == 0x25) {
      cVar2 = '\0';
      piVar1[-1] = ofs;
      piStack_58 = piVar1 + -1;
    }
    else if ((ofs == 0) && ((rb & 7) != 5)) {
      cVar2 = '\0';
      piStack_58 = piVar1;
    }
    else if (ofs == (char)(MCode)ofs) {
      piStack_58 = (int32_t *)((long)piVar1 + -1);
      *(MCode *)((long)piVar1 + -1) = (MCode)ofs;
      cVar2 = '@';
    }
    else {
      piStack_58 = piVar1 + -1;
      *piStack_58 = ofs;
      cVar2 = -0x80;
    }
    p._4_4_ = rb;
    if ((rb & 7) == 4) {
      *(MCode *)((long)piStack_58 + -1) = '$';
      piStack_58 = (int32_t *)((long)piStack_58 + -1);
    }
  }
  else {
    piVar1[-1] = ofs;
    *(MCode *)((long)piVar1 + -5) = '%';
    p._4_4_ = 4;
    cVar2 = '\0';
    piStack_58 = (int32_t *)((long)piVar1 + -5);
  }
  *(byte *)((long)piStack_58 + -1) = cVar2 + (char)((rr & 7) << 3) + ((byte)p._4_4_ & 7);
  iVar3 = (int)(char)xo;
  if (iVar3 == -0x3c) {
    *(x86Op *)((long)piStack_58 + -5) = ((rr >> 1 & 4) + (p._4_4_ >> 3 & 1)) * 0x2000 ^ xo;
    local_10 = (byte *)((long)piStack_58 + -5);
  }
  else {
    *(x86Op *)((long)piStack_58 + -5) = xo;
    pbVar5 = (byte *)((long)piStack_58 + (long)iVar3);
    iVar4 = (rr >> 1 & 0x104) + 0x40 + (p._4_4_ >> 3 & 1);
    _n = pbVar5;
    if (iVar4 != 0x40) {
      as_local._4_1_ = (byte)(rr >> 0x10) | (byte)iVar4;
      if (iVar3 == -4) {
        *pbVar5 = as_local._4_1_;
        as_local._4_1_ = (byte)(xo >> 8);
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar5 = as_local._4_1_;
        as_local._4_1_ = 0x66;
      }
      _n = pbVar5 + -1;
      pbVar5[-1] = as_local._4_1_;
    }
    local_10 = _n;
  }
  as->mcp = local_10;
  return;
}

Assistant:

static void emit_rmro(ASMState *as, x86Op xo, Reg rr, Reg rb, int32_t ofs)
{
  MCode *p = as->mcp;
  x86Mode mode;
  if (ra_hasreg(rb)) {
    if (LJ_GC64 && rb == RID_RIP) {
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = ofs;
    } else if (ofs == 0 && (rb&7) != RID_EBP) {
      mode = XM_OFS0;
    } else if (checki8(ofs)) {
      *--p = (MCode)ofs;
      mode = XM_OFS8;
    } else {
      p -= 4;
      *(int32_t *)p = ofs;
      mode = XM_OFS32;
    }
    if ((rb&7) == RID_ESP)
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
  } else {
    *(int32_t *)(p-4) = ofs;
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    p -= 5;
    rb = RID_ESP;
#else
    p -= 4;
    rb = RID_EBP;
#endif
    mode = XM_OFS0;
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}